

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O3

void __thiscall CTcGenTarg::build_source_line_maps(CTcGenTarg *this)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  CTcStreamAnchor *pCVar5;
  ulong uVar6;
  char **ppcVar7;
  CTcTokFileDesc *pCVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  CTcTokFileDesc *this_00;
  uint uVar13;
  
  for (pCVar5 = (G_cs->super_CTcDataStream).first_anchor_; pCVar5 != (CTcStreamAnchor *)0x0;
      pCVar5 = pCVar5->nxt_) {
    uVar6 = pCVar5->ofs_;
    ppcVar7 = (G_cs->super_CTcDataStream).pages_;
    uVar11 = (uVar6 + 8) / 65000;
    uVar12 = (uVar6 + 9) / 65000;
    if (CONCAT11(ppcVar7[uVar12][uVar12 * -65000 + uVar6 + 9],
                 ppcVar7[uVar11][uVar11 * -65000 + uVar6 + 8]) != 0) {
      lVar10 = uVar6 + (uint)CONCAT11(ppcVar7[uVar12][uVar12 * -65000 + uVar6 + 9],
                                      ppcVar7[uVar11][uVar11 * -65000 + uVar6 + 8]);
      uVar11 = lVar10 + G_sizes.dbg_hdr;
      uVar12 = lVar10 + G_sizes.dbg_hdr + 1;
      uVar13 = (uint)CONCAT11(ppcVar7[uVar12 / 65000][uVar12 % 65000],
                              ppcVar7[uVar11 / 65000][uVar11 % 65000]);
      if (uVar13 != 0) {
        uVar6 = pCVar5->addr_;
        uVar11 = uVar11 + 2;
        do {
          ppcVar7 = (G_cs->super_CTcDataStream).pages_;
          cVar1 = ppcVar7[uVar11 / 65000][uVar11 % 65000];
          uVar12 = (uVar11 + 1) / 65000;
          cVar2 = ppcVar7[uVar12][uVar12 * -65000 + uVar11 + 1];
          uVar12 = (uVar11 + 2) / 65000;
          bVar3 = ppcVar7[uVar12][uVar12 * -65000 + uVar11 + 2];
          uVar12 = (uVar11 + 3) / 65000;
          bVar4 = ppcVar7[uVar12][uVar12 * -65000 + uVar11 + 3];
          uVar9 = CTcDataStream::readu4_at(&G_cs->super_CTcDataStream,uVar11 + 4);
          pCVar8 = *(CTcTokFileDesc **)
                    ((long)G_tok->desc_list_ + (ulong)((uint)bVar4 * 0x800 + (uint)bVar3 * 8));
          this_00 = pCVar8->orig_;
          if (this_00 == (CTcTokFileDesc *)0x0) {
            this_00 = pCVar8;
          }
          CTcTokFileDesc::add_source_line(this_00,(ulong)uVar9,CONCAT11(cVar2,cVar1) + uVar6);
          uVar11 = uVar11 + (long)G_sizes.dbg_line;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
    }
  }
  return;
}

Assistant:

void CTcGenTarg::build_source_line_maps()
{
    CTcStreamAnchor *anchor;

    /* go through the list of anchors in the code stream */
    for (anchor = G_cs->get_first_anchor() ; anchor != 0 ;
         anchor = anchor->nxt_)
    {
        ulong start_ofs;
        ulong start_addr;
        ulong dbg_ofs;
        uint cnt;
        ulong ofs;

        /* get the anchor's stream offset */
        start_ofs = anchor->get_ofs();

        /* get the anchor's absolute address in the image file */
        start_addr = anchor->get_addr();

        /* read the debug table offset from the method header */
        dbg_ofs = start_ofs + G_cs->readu2_at(start_ofs + 8);

        /* if there's no debug table for this method, go on to the next */
        if (dbg_ofs == start_ofs)
            continue;

        /* read the number of line entries */
        cnt = G_cs->readu2_at(dbg_ofs + G_sizes.dbg_hdr);

        /* go through the individual line entries */
        for (ofs = dbg_ofs + G_sizes.dbg_hdr + 2 ; cnt != 0 ;
             --cnt, ofs += G_sizes.dbg_line)
        {
            uint file_id;
            ulong linenum;
            uint method_ofs;
            ulong line_addr;
            CTcTokFileDesc *file_desc;
            
            /* 
             *   get the file position, and the byte-code offset from the
             *   start of the method of the executable code for the line 
             */
            method_ofs = G_cs->readu2_at(ofs);
            file_id = G_cs->readu2_at(ofs + 2);
            linenum = G_cs->readu4_at(ofs + 4);

            /* calculate the absolute address of the line in the image file */
            line_addr = start_addr + method_ofs;

            /* find the given file descriptor */
            file_desc = G_tok->get_filedesc(file_id);

            /* 
             *   get the original file descriptor, since we always want to
             *   add to the original, not to the duplicates, if the file
             *   appears more than once (because this is a one-way mapping
             *   from file to byte-code location - we thus require a
             *   single index)
             */
            if (file_desc->get_orig() != 0)
                file_desc = file_desc->get_orig();

            /* add this line to the file descriptor */
            file_desc->add_source_line(linenum, line_addr);
        }
    }
}